

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O0

vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
* BipartiteGraph::getIncidenceMatrix
            (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges1,
            vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges2)

{
  byte bVar1;
  deque<bool,_std::allocator<bool>_> *this;
  Bipartition *pBVar2;
  Bipartition *pBVar3;
  reference __n;
  reference pvVar4;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RDX;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RSI;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *in_RDI;
  size_t j;
  size_t i;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *incidenceMatrix;
  undefined7 in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  value_type *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff38;
  undefined1 *__n_00;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *__n_01;
  Bipartition *local_98;
  deque<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  Bipartition *this_00;
  Bipartition *__n_02;
  undefined1 local_85 [20];
  undefined1 local_71;
  undefined1 local_19;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_18;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_10;
  
  local_19 = 0;
  __n_01 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  this = (deque<bool,_std::allocator<bool>_> *)
         std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(in_RSI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(local_18);
  local_71 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x153f7c);
  std::deque<bool,_std::allocator<bool>_>::deque
            (this,(size_type)__n_01,(value_type *)in_RDI,in_stack_ffffffffffffff38);
  __n_00 = local_85;
  std::allocator<std::deque<bool,_std::allocator<bool>_>_>::allocator
            ((allocator<std::deque<bool,_std::allocator<bool>_>_> *)0x153fa6);
  std::
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  ::vector(in_RDI,(size_type)__n_00,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::allocator<std::deque<bool,_std::allocator<bool>_>_>::~allocator
            ((allocator<std::deque<bool,_std::allocator<bool>_>_> *)0x153fcb);
  std::deque<bool,_std::allocator<bool>_>::~deque(in_stack_ffffffffffffff70);
  std::allocator<bool>::~allocator((allocator<bool> *)0x153fdf);
  this_00 = (Bipartition *)0x0;
  while (__n_02 = this_00,
        pBVar2 = (Bipartition *)
                 std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(local_10),
        this_00 < pBVar2) {
    local_98 = (Bipartition *)0x0;
    while (pBVar2 = local_98,
          pBVar3 = (Bipartition *)
                   std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(local_18),
          pBVar2 < pBVar3) {
      __n = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                      (local_10,(size_type)__n_02);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                (local_18,(size_type)local_98);
      bVar1 = Bipartition::crosses(this_00,pBVar2);
      std::
      vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
      ::operator[](in_RDI,(size_type)__n_02);
      pvVar4 = std::deque<bool,_std::allocator<bool>_>::operator[]
                         ((deque<bool,_std::allocator<bool>_> *)
                          CONCAT17(bVar1,in_stack_ffffffffffffff20),(size_type)__n);
      *pvVar4 = (value_type)(bVar1 & 1);
      local_98 = (Bipartition *)((long)&local_98->_vptr_Bipartition + 1);
    }
    this_00 = (Bipartition *)((long)&__n_02->_vptr_Bipartition + 1);
  }
  return __n_01;
}

Assistant:

vector<deque<bool>> BipartiteGraph::getIncidenceMatrix(vector<PhyloTreeEdge>& edges1, vector<PhyloTreeEdge>& edges2) {
    std::vector<std::deque<bool>> incidenceMatrix(edges1.size(), std::deque<bool>(edges2.size(), false));
    for (size_t i = 0; i < edges1.size(); i++) {
        for (size_t j = 0; j < edges2.size(); j++) {
            incidenceMatrix[i][j] = edges1[i].crosses(edges2[j]);
        }
    }
    return incidenceMatrix;
}